

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O3

future<int> __thiscall prometheus::Gateway::async_push(Gateway *this,HttpMethod method)

{
  element_type *peVar1;
  CollectableEntry *pCVar2;
  int iVar3;
  _Atomic_word _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Result<int> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined8 uVar9;
  undefined4 in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CollectableEntry *collectable;
  undefined4 in_register_00000034;
  Gateway *pGVar10;
  CollectableEntry *pCVar11;
  _State_baseV2 *__tmp;
  bool bVar12;
  future<int> fVar13;
  shared_ptr<std::__future_base::_State_baseV2> __state_1;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> futures;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  string uri;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> metrics;
  undefined1 local_138 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  undefined1 local_128 [16];
  undefined8 uStack_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_108;
  Gateway *local_100;
  long *local_f8;
  undefined4 local_ec;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> local_e8;
  __state_type local_c8;
  pthread_mutex_t *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  string local_a0;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> local_80;
  Gateway *local_68;
  CollectableEntry *local_60;
  __basic_future<int> local_58;
  Serializer local_48;
  _func_int **local_40 [2];
  
  pGVar10 = (Gateway *)CONCAT44(in_register_00000034,method);
  local_48._vptr_Serializer = (_func_int **)&PTR__Serializer_00123cf8;
  local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = (pthread_mutex_t *)&pGVar10->mutex_;
  local_ec = in_EDX;
  local_68 = this;
  iVar3 = pthread_mutex_lock(local_b0);
  if (iVar3 != 0) {
    uVar9 = ::std::__throw_system_error(iVar3);
    if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_130._M_pi);
    }
    pthread_mutex_unlock(local_b0);
    ::std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::~vector(&local_e8);
    _Unwind_Resume(uVar9);
  }
  collectable = (pGVar10->collectables_).
                super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pCVar11 = (pGVar10->collectables_).
            super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pCVar2 = pCVar11;
  if (collectable != pCVar11) {
    do {
      local_60 = pCVar2;
      p_Var8 = (collectable->first).
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var4 = p_Var8->_M_use_count;
        do {
          if (_Var4 == 0) goto LAB_00107b56;
          LOCK();
          iVar3 = p_Var8->_M_use_count;
          bVar12 = _Var4 == iVar3;
          if (bVar12) {
            p_Var8->_M_use_count = _Var4 + 1;
            iVar3 = _Var4;
          }
          _Var4 = iVar3;
          UNLOCK();
        } while (!bVar12);
        peVar1 = (collectable->first).
                 super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 != (element_type *)0x0 && p_Var8->_M_use_count != 0) {
          (*peVar1->_vptr_Collectable[2])(&local_80);
          Serializer::Serialize_abi_cxx11_((string *)local_138,&local_48,&local_80);
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
          p_Var5->_M_use_count = 1;
          p_Var5->_M_weak_count = 1;
          p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00123a10;
          p_Var6 = p_Var5 + 2;
          p_Var5[1]._vptr__Sp_counted_base = (_func_int **)p_Var6;
          if (local_138 == (undefined1  [8])local_128) {
            p_Var6->_vptr__Sp_counted_base = (_func_int **)local_128._0_8_;
            p_Var5[2]._M_use_count = (int)CONCAT71(local_128._9_7_,local_128[8]);
            p_Var5[2]._M_weak_count = SUB74(local_128._9_7_,3);
          }
          else {
            p_Var5[1]._vptr__Sp_counted_base = (_func_int **)local_138;
            p_Var6->_vptr__Sp_counted_base = (_func_int **)local_128._0_8_;
          }
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var5[1]._M_use_count =
               _Stack_130._M_pi;
          local_a8 = p_Var5;
          getUri(&local_a0,pGVar10,collectable);
          local_138._0_4_ = local_ec;
          _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&_Stack_130,local_a0._M_dataplus._M_p,
                     local_a0._M_dataplus._M_p + local_a0._M_string_length);
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
          local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_110 = p_Var5 + 1;
          p_Stack_108 = p_Var5;
          local_100 = pGVar10;
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x88);
          p_Var6->_M_use_count = 1;
          p_Var6->_M_weak_count = 1;
          p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00123670;
          p_Var6[1]._M_use_count = 0;
          p_Var6[1]._M_weak_count = 0;
          *(undefined4 *)&p_Var6[2]._vptr__Sp_counted_base = 0;
          *(undefined1 *)((long)&p_Var6[2]._vptr__Sp_counted_base + 4) = 0;
          p_Var6[2]._M_use_count = 0;
          p_Var6[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var6[3]._M_use_count = 0;
          p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_001236c0;
          p_Var7 = (_Result<int> *)operator_new(0x18);
          ::std::__future_base::_Result<int>::_Result(p_Var7);
          p_Var5 = p_Stack_108;
          p_Var6[4]._vptr__Sp_counted_base = (_func_int **)p_Var7;
          p_Var6[4]._M_use_count = local_138._0_4_;
          p_Var6[5]._vptr__Sp_counted_base = (_func_int **)(p_Var6 + 6);
          if (_Stack_130._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8)) {
            p_Var6[6]._vptr__Sp_counted_base = (_func_int **)CONCAT71(local_128._9_7_,local_128[8]);
            p_Var6[6]._M_use_count = (undefined4)uStack_118;
            p_Var6[6]._M_weak_count = uStack_118._4_4_;
          }
          else {
            p_Var6[5]._vptr__Sp_counted_base = (_func_int **)_Stack_130._M_pi;
            p_Var6[6]._vptr__Sp_counted_base = (_func_int **)CONCAT71(local_128._9_7_,local_128[8]);
          }
          p_Var6[5]._M_use_count = local_128._0_4_;
          p_Var6[5]._M_weak_count = local_128._4_4_;
          local_128._0_8_ = (_func_int **)0x0;
          local_128[8] = '\0';
          p_Stack_108 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var6[7]._vptr__Sp_counted_base = (_func_int **)local_110;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var6[7]._M_use_count = p_Var5;
          local_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var6[8]._vptr__Sp_counted_base = (_func_int **)local_100;
          local_40[0] = (_func_int **)0x0;
          _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8);
          local_f8 = (long *)operator_new(0x20);
          *local_f8 = (long)&PTR___State_00123718;
          local_f8[1] = (long)(p_Var6 + 1);
          local_f8[2] = (long)::std::__future_base::
                              _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:167:54)>_>,_int>
                              ::_M_run;
          local_f8[3] = 0;
          ::std::thread::_M_start_thread(local_40,&local_f8,0);
          if (local_f8 != (long *)0x0) {
            (**(code **)(*local_f8 + 8))();
          }
          if (p_Var6[3]._vptr__Sp_counted_base != (_func_int **)0x0) goto LAB_00107cbc;
          p_Var6[3]._vptr__Sp_counted_base = local_40[0];
          local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)(p_Var6 + 1);
          local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          ::std::__basic_future<int>::__basic_future(&local_58,&local_c8);
          pCVar11 = local_60;
          if (local_c8.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          p_Var5 = local_a8;
          ::std::vector<std::future<int>,std::allocator<std::future<int>>>::
          emplace_back<std::future<int>>
                    ((vector<std::future<int>,std::allocator<std::future<int>>> *)&local_e8,
                     (future<int> *)&local_58);
          if (local_58._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_58._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (p_Stack_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_108);
          }
          if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8)) {
            operator_delete(_Stack_130._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          ::std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::
          ~vector(&local_80);
        }
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
      }
LAB_00107b56:
      collectable = collectable + 1;
      pCVar2 = local_60;
    } while (collectable != pCVar11);
  }
  local_138 = (undefined1  [8])0x0;
  _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00123758;
  p_Var8[1]._M_use_count = 0;
  p_Var8[1]._M_weak_count = 0;
  *(undefined4 *)&p_Var8[2]._vptr__Sp_counted_base = 0;
  *(undefined1 *)((long)&p_Var8[2]._vptr__Sp_counted_base + 4) = 0;
  p_Var8[2]._M_use_count = 0;
  p_Var8[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[3]._M_use_count = 0;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_001237a8;
  p_Var7 = (_Result<int> *)operator_new(0x18);
  ::std::__future_base::_Result<int>::_Result(p_Var7);
  p_Var8[4]._vptr__Sp_counted_base = (_func_int **)p_Var7;
  *(pointer *)&p_Var8[4]._M_use_count =
       local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  p_Var8[5]._vptr__Sp_counted_base =
       (_func_int **)
       local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)&p_Var8[5]._M_use_count =
       local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0._M_dataplus._M_p = (pointer)0x0;
  local_80.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  ((local_80.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
    ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p =
       (pointer)&PTR___State_00123800;
  ((local_80.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
    ._M_impl.super__Vector_impl_data._M_start)->name)._M_string_length = (size_type)(p_Var8 + 1);
  ((local_80.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
    ._M_impl.super__Vector_impl_data._M_start)->name).field_2._M_allocated_capacity =
       (size_type)
       ::std::__future_base::
       _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:172:30),_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>_>,_int>
       ::_M_run;
  *(undefined8 *)
   ((long)&((local_80.
             super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
             ._M_impl.super__Vector_impl_data._M_start)->name).field_2 + 8) = 0;
  ::std::thread::_M_start_thread(&local_a0,&local_80,0);
  if (local_80.
      super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(((local_80.
                   super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                   ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + 8))();
  }
  pGVar10 = local_68;
  if (p_Var8[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
    p_Var8[3]._vptr__Sp_counted_base = (_func_int **)local_a0._M_dataplus._M_p;
    local_138 = (undefined1  [8])(p_Var8 + 1);
    _Stack_130._M_pi = p_Var8;
    ::std::__basic_future<int>::__basic_future
              ((__basic_future<int> *)local_68,(__state_type *)local_138);
    if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_130._M_pi);
    }
    pthread_mutex_unlock(local_b0);
    ::std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::~vector(&local_e8);
    fVar13.super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    fVar13.super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pGVar10;
    return (future<int>)
           fVar13.super___basic_future<int>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
  }
LAB_00107cbc:
  ::std::terminate();
}

Assistant:

std::future<int> Gateway::async_push(detail::HttpMethod method) {
  const auto serializer = TextSerializer{};
  std::vector<std::future<int>> futures;

  std::lock_guard<std::mutex> lock{mutex_};
  for (auto& wcollectable : collectables_) {
    auto collectable = wcollectable.first.lock();
    if (!collectable) {
      continue;
    }

    auto metrics = collectable->Collect();
    auto body = std::make_shared<std::string>(serializer.Serialize(metrics));
    auto uri = getUri(wcollectable);

    futures.push_back(std::async(std::launch::async, [method, uri, body, this] {
      return curlWrapper_->performHttpRequest(method, uri, *body);
    }));
  }

  const auto reduceFutures = [](std::vector<std::future<int>> lfutures) {
    auto final_status_code = 200;

    for (auto& future : lfutures) {
      auto status_code = future.get();

      if (status_code < 100 || status_code >= 400) {
        final_status_code = status_code;
      }
    }

    return final_status_code;
  };

  return std::async(std::launch::async, reduceFutures, std::move(futures));
}